

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::number::FormattedNumber::toString
          (UnicodeString *__return_storage_ptr__,FormattedNumber *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  FormattedNumber *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
      ICU_Utility::makeBogusString();
    }
    else {
      impl::NumberStringBuilder::toUnicodeString(__return_storage_ptr__,&this->fResults->string);
    }
  }
  else {
    ICU_Utility::makeBogusString();
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString FormattedNumber::toString(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return ICU_Utility::makeBogusString();
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return ICU_Utility::makeBogusString();
    }
    return fResults->string.toUnicodeString();
}